

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

void __thiscall icu_63::RegexMatcher::~RegexMatcher(RegexMatcher *this)

{
  RegexPattern *this_00;
  void *in_RSI;
  
  if (this->fStack != (UVector64 *)0x0) {
    (*(this->fStack->super_UObject)._vptr_UObject[1])();
  }
  if (this->fData != this->fSmallData) {
    uprv_free_63(this->fData);
    this->fData = (int64_t *)0x0;
  }
  this_00 = this->fPatternOwned;
  if (this_00 != (RegexPattern *)0x0) {
    RegexPattern::~RegexPattern(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
    this->fPattern = (RegexPattern *)0x0;
    this->fPatternOwned = (RegexPattern *)0x0;
  }
  if (this->fInput != (UnicodeString *)0x0) {
    (*(this->fInput->super_Replaceable).super_UObject._vptr_UObject[1])();
  }
  if (this->fInputText != (UText *)0x0) {
    utext_close_63(this->fInputText);
  }
  if (this->fAltInputText != (UText *)0x0) {
    utext_close_63(this->fAltInputText);
  }
  if (this->fWordBreakItr != (RuleBasedBreakIterator *)0x0) {
    (*(this->fWordBreakItr->super_BreakIterator).super_UObject._vptr_UObject[1])();
  }
  UObject::~UObject(&this->super_UObject);
  return;
}

Assistant:

RegexMatcher::~RegexMatcher() {
    delete fStack;
    if (fData != fSmallData) {
        uprv_free(fData);
        fData = NULL;
    }
    if (fPatternOwned) {
        delete fPatternOwned;
        fPatternOwned = NULL;
        fPattern = NULL;
    }

    if (fInput) {
        delete fInput;
    }
    if (fInputText) {
        utext_close(fInputText);
    }
    if (fAltInputText) {
        utext_close(fAltInputText);
    }

    #if UCONFIG_NO_BREAK_ITERATION==0
    delete fWordBreakItr;
    #endif
}